

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_column_tests.h
# Opt level: O1

void column_test_row_access_constructors<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>>>>>
               (vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                *matrix,map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>_>_>_>
                        *rows)

{
  Index IVar1;
  bool bVar2;
  long lVar3;
  _Base_ptr p_Var4;
  _Rb_tree_node_base *p_Var5;
  undefined4 local_30c;
  undefined *local_308;
  undefined1 local_300 [8];
  undefined **local_2f8;
  undefined **local_2f0;
  ulong local_2e8;
  shared_count sStack_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  shared_count sStack_2c0;
  undefined **local_2b8;
  undefined1 local_2b0;
  undefined8 *local_2a8;
  undefined ***local_2a0;
  _Rb_tree_node_base *local_298;
  Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  *local_290;
  char *local_288;
  undefined **local_280;
  char *local_278;
  shared_count sStack_270;
  char *local_268;
  map<unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>_>_>_>
  *local_260;
  vector<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
  *local_258;
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  moveCol;
  undefined1 *local_1e0;
  undefined1 *local_1d8;
  char *local_1d0;
  char *local_1c8;
  undefined1 *local_1c0;
  undefined1 *local_1b8;
  char *local_1b0;
  char *local_1a8;
  undefined1 *local_1a0;
  undefined1 *local_198;
  char *local_190;
  char *local_188;
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  col;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  undefined1 *local_c0;
  undefined1 *local_b8;
  char *local_b0;
  char *local_a8;
  char *local_a0;
  char *local_98;
  undefined1 *local_90;
  undefined1 *local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  build_rows<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ();
  get_ordered_rows<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&col,(vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&col);
  build_column_values<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ();
  get_ordered_column_contents<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&moveCol,matrix);
  test_matrix_equality<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>
            ((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
              *)&col,(vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
                      *)&moveCol);
  std::
  vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::set<std::pair<unsigned_int,_unsigned_int>,_std::less<std::pair<unsigned_int,_unsigned_int>_>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&moveCol);
  std::
  vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
  ::~vector((vector<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>,_std::allocator<std::vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>_>_>
             *)&col);
  local_258 = matrix;
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
  ::
  Vector_column<std::map<unsigned_int,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::set<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>,Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>::RowEntryComp<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>,std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>>>>>>>
            ((Vector_column<Column_mini_matrix<Base_col_options<false,(Gudhi::persistence_matrix::Column_types)3,true,true,false>>>
              *)&col,(matrix->
                     super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,6,rows,(Column_settings *)0x0);
  p_Var4 = (rows->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_298 = &(rows->_M_t)._M_impl.super__Rb_tree_header._M_header;
  local_260 = rows;
  if (p_Var4 != local_298) {
    do {
      if (p_Var4[2]._M_left != (_Base_ptr)0x0) {
        lVar3 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var4[1]._M_left);
        if ((*(uint *)(lVar3 + 0x28) < 6) && ((0x2bU >> (*(uint *)(lVar3 + 0x28) & 0x1f) & 1) != 0))
        {
          local_190 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_188 = "";
          local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_198 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_190,0x20d,
                     &local_1a0);
          local_2e8 = local_2e8 & 0xffffffffffffff00;
          local_2f0 = &PTR__lazy_ostream_0022e430;
          sStack_2e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_2d8 = "";
          local_300._0_4_ = *(int *)(lVar3 + 0x20);
          local_308 = (undefined *)CONCAT44(local_308._4_4_,6);
          local_280 = (undefined **)CONCAT71(local_280._1_7_,*(int *)(lVar3 + 0x20) == 6);
          local_278 = (char *)0x0;
          sStack_270.pi_ = (sp_counted_base *)0x0;
          local_2d0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_2c8 = "";
          local_290 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                       *)local_300;
          moveCol.super_Row_access_option.rows_ =
               (Row_container *)((ulong)moveCol.super_Row_access_option.rows_ & 0xffffffffffffff00);
          moveCol.super_Row_access_option._0_8_ = &PTR__lazy_ostream_0022e930;
          moveCol.column_.
          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_start = (pointer)&boost::unit_test::lazy_ostream::inst
          ;
          moveCol.column_.
          super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
          ._M_impl.super__Vector_impl_data._M_finish = &local_290;
          local_2f8 = &local_308;
          local_2b0 = 0;
          local_2b8 = &PTR__lazy_ostream_0022e6b0;
          local_2a8 = &boost::unit_test::lazy_ostream::inst;
          local_2a0 = &local_2f8;
          boost::test_tools::tt_detail::report_assertion
                    (&local_280,&local_2f0,&local_2d0,0x20d,1,2,2,"entry.get_column_index()",
                     &moveCol,"6",&local_2b8);
          boost::detail::shared_count::~shared_count(&sStack_270);
        }
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while (p_Var4 != local_298);
  }
  IVar1 = col.super_Row_access_option.columnIndex_;
  col.super_Row_access_option.columnIndex_ = 0;
  moveCol.super_Row_access_option.columnIndex_ = IVar1;
  moveCol.super_Row_access_option.rows_ = col.super_Row_access_option.rows_;
  moveCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start =
       col.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_start;
  moveCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       col.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  moveCol.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       col.column_.
       super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  col.column_.
  super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::_Hashtable(&moveCol.erasedValues_._M_h,&col.erasedValues_,&col.erasedValues_);
  moveCol.operators_._0_4_ = col.operators_._0_4_;
  moveCol.operators_._4_4_ = col.operators_._4_4_;
  moveCol.entryPool_._0_4_ = col.entryPool_._0_4_;
  moveCol.entryPool_._4_4_ = col.entryPool_._4_4_;
  col.operators_ = (Field_operators *)0x0;
  col.entryPool_ = (Entry_constructor *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x21c);
  local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
  local_280 = &PTR__lazy_ostream_0022e430;
  sStack_270.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_268 = "";
  local_308 = (undefined *)
              (((long)moveCol.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)moveCol.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) -
              moveCol.erasedValues_._M_h._M_element_count);
  local_2f8 = &local_308;
  local_300 = (undefined1  [8])&local_30c;
  local_30c = 4;
  local_2c8 = (char *)0x0;
  sStack_2c0.pi_ = (sp_counted_base *)0x0;
  local_290 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1e9df2;
  local_288 = "";
  local_2a0 = &local_2f8;
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_0022e3f0;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2d8 = local_300;
  local_2e8 = local_2e8 & 0xffffffffffffff00;
  local_2f0 = &PTR__lazy_ostream_0022e6b0;
  sStack_2e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2d0._0_1_ = local_308 == (undefined *)0x4;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2c0);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x21d);
  local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
  local_280 = &PTR__lazy_ostream_0022e430;
  sStack_270.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_268 = "";
  local_308 = (undefined *)
              (((long)col.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)col.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) -
              col.erasedValues_._M_h._M_element_count);
  local_2d0 = (char *)CONCAT71(local_2d0._1_7_,local_308 == (undefined *)0x0);
  local_30c = 0;
  local_2c8 = (char *)0x0;
  sStack_2c0.pi_ = (sp_counted_base *)0x0;
  local_290 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1e9df2;
  local_288 = "";
  local_2f8 = &local_308;
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_0022e3f0;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = &local_2f8;
  local_300 = (undefined1  [8])&local_30c;
  local_2e8 = local_2e8 & 0xffffffffffffff00;
  local_2f0 = &PTR__lazy_ostream_0022e6b0;
  sStack_2e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2d8 = local_300;
  boost::test_tools::tt_detail::report_assertion
            (&local_2d0,&local_280,&local_290,0x21d,1,2,2,"col.size()",&local_2b8,"0",&local_2f0);
  boost::detail::shared_count::~shared_count(&sStack_2c0);
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_78 = "";
  local_90 = &boost::unit_test::basic_cstring<char_const>::null;
  local_88 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_80,0x21e);
  bVar2 = Gudhi::persistence_matrix::operator==
                    ((local_258->
                     super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,&moveCol);
  local_2f0 = (undefined **)CONCAT71(local_2f0._1_7_,bVar2);
  local_2e8 = 0;
  sStack_2e0.pi_ = (sp_counted_base *)0x0;
  local_280 = (undefined **)0x1f439f;
  local_278 = "";
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_0022e378;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_98 = "";
  local_2a0 = &local_280;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2e0);
  p_Var5 = (local_260->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var5 != local_298) {
    do {
      if (p_Var5[2]._M_left != (_Base_ptr)0x0) {
        lVar3 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var5[1]._M_left);
        if ((*(uint *)(lVar3 + 0x28) < 6) && ((0x2bU >> (*(uint *)(lVar3 + 0x28) & 0x1f) & 1) != 0))
        {
          local_1b0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_1a8 = "";
          local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1b8 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1b0,0x225,
                     &local_1c0);
          local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
          local_280 = &PTR__lazy_ostream_0022e430;
          sStack_270.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_268 = "";
          local_308 = (undefined *)CONCAT44(local_308._4_4_,*(int *)(lVar3 + 0x20));
          local_30c = 6;
          local_2d0 = (char *)CONCAT71(local_2d0._1_7_,*(int *)(lVar3 + 0x20) == 6);
          local_2c8 = (char *)0x0;
          sStack_2c0.pi_ = (sp_counted_base *)0x0;
          local_290 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                       *)0x1e9df2;
          local_288 = "";
          local_2f8 = &local_308;
          local_2b0 = 0;
          local_2b8 = &PTR__lazy_ostream_0022e930;
          local_2a8 = &boost::unit_test::lazy_ostream::inst;
          local_2a0 = &local_2f8;
          local_300 = (undefined1  [8])&local_30c;
          local_2e8 = local_2e8 & 0xffffffffffffff00;
          local_2f0 = &PTR__lazy_ostream_0022e6b0;
          sStack_2e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_2d8 = local_300;
          boost::test_tools::tt_detail::report_assertion
                    (&local_2d0,&local_280,&local_290,0x225,1,2,2,"entry.get_column_index()",
                     &local_2b8,"6",&local_2f0);
          boost::detail::shared_count::~shared_count(&sStack_2c0);
        }
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_298);
  }
  Gudhi::persistence_matrix::swap(&col,&moveCol);
  local_b0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_a8 = "";
  local_c0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_b8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_b0,0x234);
  local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
  local_280 = &PTR__lazy_ostream_0022e430;
  sStack_270.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_268 = "";
  local_308 = (undefined *)
              (((long)moveCol.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)moveCol.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) -
              moveCol.erasedValues_._M_h._M_element_count);
  local_30c = 0;
  local_2c8 = (char *)0x0;
  sStack_2c0.pi_ = (sp_counted_base *)0x0;
  local_290 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1e9df2;
  local_288 = "";
  local_2f8 = &local_308;
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_0022e3f0;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = &local_2f8;
  local_300 = (undefined1  [8])&local_30c;
  local_2e8 = local_2e8 & 0xffffffffffffff00;
  local_2f0 = &PTR__lazy_ostream_0022e6b0;
  sStack_2e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2d8 = local_300;
  local_2d0._0_1_ = local_308 == (undefined *)0x0;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2c0);
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x235);
  local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
  local_280 = &PTR__lazy_ostream_0022e430;
  sStack_270.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_268 = "";
  local_308 = (undefined *)
              (((long)col.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)col.column_.
                      super__Vector_base<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*,_std::allocator<Gudhi::persistence_matrix::Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_*>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) -
              col.erasedValues_._M_h._M_element_count);
  local_2d0 = (char *)CONCAT71(local_2d0._1_7_,local_308 == (undefined *)0x4);
  local_30c = 4;
  local_2c8 = (char *)0x0;
  sStack_2c0.pi_ = (sp_counted_base *)0x0;
  local_290 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
               *)0x1e9df2;
  local_288 = "";
  local_2f8 = &local_308;
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_0022e3f0;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = &local_2f8;
  local_300 = (undefined1  [8])&local_30c;
  local_2e8 = local_2e8 & 0xffffffffffffff00;
  local_2f0 = &PTR__lazy_ostream_0022e6b0;
  sStack_2e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_2d8 = local_300;
  boost::test_tools::tt_detail::report_assertion
            (&local_2d0,&local_280,&local_290,0x235,1,2,2,"col.size()",&local_2b8,"4",&local_2f0);
  boost::detail::shared_count::~shared_count(&sStack_2c0);
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
  ;
  local_e8 = "";
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_f0,0x236);
  bVar2 = Gudhi::persistence_matrix::operator==
                    ((local_258->
                     super__Vector_base<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start,&col);
  local_2f0 = (undefined **)CONCAT71(local_2f0._1_7_,bVar2);
  local_2e8 = 0;
  sStack_2e0.pi_ = (sp_counted_base *)0x0;
  local_280 = (undefined **)0x1f43b4;
  local_278 = "";
  local_2b0 = 0;
  local_2b8 = &PTR__lazy_ostream_0022e378;
  local_2a8 = &boost::unit_test::lazy_ostream::inst;
  local_2a0 = &local_280;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_2e0);
  p_Var5 = (local_260->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var5 != local_298) {
    do {
      if (p_Var5[2]._M_left != (_Base_ptr)0x0) {
        lVar3 = std::_Rb_tree_decrement((_Rb_tree_node_base *)&p_Var5[1]._M_left);
        if ((*(uint *)(lVar3 + 0x28) < 6) && ((0x2bU >> (*(uint *)(lVar3 + 0x28) & 0x1f) & 1) != 0))
        {
          local_1d0 = 
          "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_column_tests.h"
          ;
          local_1c8 = "";
          local_1e0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1d0,0x23d,
                     &local_1e0);
          local_278 = (char *)((ulong)local_278 & 0xffffffffffffff00);
          local_280 = &PTR__lazy_ostream_0022e430;
          sStack_270.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_268 = "";
          local_308 = (undefined *)CONCAT44(local_308._4_4_,*(int *)(lVar3 + 0x20));
          local_30c = 6;
          local_2d0 = (char *)CONCAT71(local_2d0._1_7_,*(int *)(lVar3 + 0x20) == 6);
          local_2c8 = (char *)0x0;
          sStack_2c0.pi_ = (sp_counted_base *)0x0;
          local_290 = (Entry<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
                       *)0x1e9df2;
          local_288 = "";
          local_2f8 = &local_308;
          local_2b0 = 0;
          local_2b8 = &PTR__lazy_ostream_0022e930;
          local_2a8 = &boost::unit_test::lazy_ostream::inst;
          local_2a0 = &local_2f8;
          local_300 = (undefined1  [8])&local_30c;
          local_2e8 = local_2e8 & 0xffffffffffffff00;
          local_2f0 = &PTR__lazy_ostream_0022e6b0;
          sStack_2e0.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
          local_2d8 = local_300;
          boost::test_tools::tt_detail::report_assertion
                    (&local_2d0,&local_280,&local_290,0x23d,1,2,2,"entry.get_column_index()",
                     &local_2b8,"6",&local_2f0);
          boost::detail::shared_count::~shared_count(&sStack_2c0);
        }
      }
      p_Var5 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_298);
  }
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column(&moveCol);
  Gudhi::persistence_matrix::
  Vector_column<Column_mini_matrix<Base_col_options<false,_(Gudhi::persistence_matrix::Column_types)3,_true,_true,_false>_>_>
  ::~Vector_column(&col);
  return;
}

Assistant:

void column_test_row_access_constructors(std::vector<Column>& matrix, Row_container& rows) {
  test_matrix_equality<Column>(build_rows<Column>(), get_ordered_rows(matrix));
  test_matrix_equality<Column>(build_column_values<Column>(), get_ordered_column_contents(matrix));

  Column col(matrix[0], 6, &rows);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  Column moveCol(std::move(col));
  BOOST_CHECK_EQUAL(moveCol.size(), 4);
  BOOST_CHECK_EQUAL(col.size(), 0);
  BOOST_CHECK(matrix[0] == moveCol);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }

  swap(col, moveCol);
  BOOST_CHECK_EQUAL(moveCol.size(), 0);
  BOOST_CHECK_EQUAL(col.size(), 4);
  BOOST_CHECK(matrix[0] == col);
  for (auto& r : rows) {
    if constexpr (Column::Master::Option_list::has_removable_rows) {
      if (!r.second.empty()) {
        auto& entry = *r.second.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    } else {
      if (!r.empty()) {
        auto& entry = *r.rbegin();
        if (entry.get_row_index() == 0 || entry.get_row_index() == 1 || entry.get_row_index() == 3 ||
            entry.get_row_index() == 5) {
          BOOST_CHECK_EQUAL(entry.get_column_index(), 6);
        }
      }
    }
  }
}